

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

void ggml_unravel_index(ggml_tensor *tensor,int64_t i,int64_t *i0,int64_t *i1,int64_t *i2,
                       int64_t *i3)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar1 = tensor->ne[0];
  lVar5 = tensor->ne[1] * lVar1;
  lVar3 = tensor->ne[2] * lVar5;
  lVar2 = i / lVar3;
  lVar4 = i - lVar3 * lVar2;
  lVar3 = lVar4 / lVar5;
  lVar4 = lVar4 - lVar5 * lVar3;
  if (i0 != (int64_t *)0x0) {
    *i0 = lVar4 % lVar1;
  }
  if (i1 != (int64_t *)0x0) {
    *i1 = lVar4 / lVar1;
  }
  if (i2 != (int64_t *)0x0) {
    *i2 = lVar3;
  }
  if (i3 != (int64_t *)0x0) {
    *i3 = lVar2;
  }
  return;
}

Assistant:

void ggml_unravel_index(const struct ggml_tensor * tensor, int64_t i, int64_t * i0, int64_t * i1, int64_t * i2, int64_t * i3) {
    const int64_t ne2 = tensor->ne[2];
    const int64_t ne1 = tensor->ne[1];
    const int64_t ne0 = tensor->ne[0];

    const int64_t i3_ = (i/(ne2*ne1*ne0));
    const int64_t i2_ = (i - i3_*ne2*ne1*ne0)/(ne1*ne0);
    const int64_t i1_ = (i - i3_*ne2*ne1*ne0 - i2_*ne1*ne0)/ne0;
    const int64_t i0_ = (i - i3_*ne2*ne1*ne0 - i2_*ne1*ne0 - i1_*ne0);

    if (i0) {
        * i0 = i0_;
    }
    if (i1) {
        * i1 = i1_;
    }
    if (i2) {
        * i2 = i2_;
    }
    if (i3) {
        * i3 = i3_;
    }
}